

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

TestPartResultReporterInterface ** __thiscall
testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
          (ThreadLocal<testing::TestPartResultReporterInterface_*> *this)

{
  ValueHolder *pVVar1;
  ostream *poVar2;
  GTestLog local_48;
  int local_44;
  ValueHolder *pVStack_40;
  int gtest_error;
  ThreadLocalValueHolderBase *holder_base;
  ValueHolder *local_28;
  ValueHolder *new_holder;
  ThreadLocalValueHolderBase *holder;
  ThreadLocal<testing::TestPartResultReporterInterface_*> *this_local;
  
  holder = (ThreadLocalValueHolderBase *)this;
  new_holder = (ValueHolder *)pthread_getspecific(this->key_);
  if (new_holder == (ValueHolder *)0x0) {
    pVVar1 = (ValueHolder *)operator_new(0x10);
    ValueHolder::ValueHolder(pVVar1,&this->default_);
    pVStack_40 = pVVar1;
    local_28 = pVVar1;
    local_44 = pthread_setspecific(this->key_,pVVar1);
    if (local_44 != 0) {
      GTestLog::GTestLog(&local_48,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]bvh3/lib/gtest/include/gtest/internal/gtest-port.h"
                         ,0x5f5);
      poVar2 = GTestLog::GetStream(&local_48);
      poVar2 = std::operator<<(poVar2,"pthread_setspecific(key_, holder_base)");
      poVar2 = std::operator<<(poVar2,"failed with error ");
      std::ostream::operator<<(poVar2,local_44);
      GTestLog::~GTestLog(&local_48);
    }
    this_local = (ThreadLocal<testing::TestPartResultReporterInterface_*> *)
                 ValueHolder::pointer(local_28);
  }
  else {
    pVVar1 = CheckedDowncastToActualType<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
                       ((ThreadLocalValueHolderBase *)new_holder);
    this_local = (ThreadLocal<testing::TestPartResultReporterInterface_*> *)
                 ValueHolder::pointer(pVVar1);
  }
  return (TestPartResultReporterInterface **)this_local;
}

Assistant:

T* GetOrCreateValue() const {
    ThreadLocalValueHolderBase* const holder =
        static_cast<ThreadLocalValueHolderBase*>(pthread_getspecific(key_));
    if (holder != NULL) {
      return CheckedDowncastToActualType<ValueHolder>(holder)->pointer();
    }

    ValueHolder* const new_holder = new ValueHolder(default_);
    ThreadLocalValueHolderBase* const holder_base = new_holder;
    GTEST_CHECK_POSIX_SUCCESS_(pthread_setspecific(key_, holder_base));
    return new_holder->pointer();
  }